

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

S2Point * __thiscall
s2textformat::MakePointOrDie(S2Point *__return_storage_ptr__,s2textformat *this,string_view str)

{
  bool bVar1;
  ostream *poVar2;
  absl *this_00;
  size_type sVar3;
  string_view piece;
  string_view str_00;
  S2LogMessage SStack_28;
  
  piece.ptr_ = str.ptr_;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  str_00.length_ = (size_type)piece.ptr_;
  str_00.ptr_ = (char *)this;
  bVar1 = MakePoint(str_00,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  sVar3 = 3;
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x60,kFatal,(ostream *)&std::cerr);
  poVar2 = std::operator<<(SStack_28.stream_,"Check failed: MakePoint(str, &point) ");
  this_00 = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  poVar2 = absl::operator<<(this_00,(ostream *)this,piece);
  std::operator<<(poVar2,"\"");
  abort();
}

Assistant:

S2Point MakePointOrDie(string_view str) {
  S2Point point;
  S2_CHECK(MakePoint(str, &point)) << ": str == \"" << str << "\"";
  return point;
}